

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_crt_verify_top(mbedtls_x509_crt *child,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
                       mbedtls_x509_crt_profile *profile,int path_cnt,int self_cnt,uint32_t *flags,
                       _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy
                       )

{
  mbedtls_md_type_t md_alg;
  mbedtls_pk_type_t type;
  void *options;
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 in_register_00000084;
  uint32_t ca_flags;
  int local_b0;
  uint local_ac;
  mbedtls_x509_crt *local_a8;
  undefined8 local_a0;
  mbedtls_x509_crt_profile *local_98;
  int local_8c;
  mbedtls_x509_crl *local_88;
  mbedtls_md_info_t *local_80;
  uchar hash [64];
  
  local_a0 = CONCAT44(in_register_00000084,path_cnt);
  ca_flags = 0;
  local_98 = profile;
  local_8c = self_cnt;
  local_88 = ca_crl;
  iVar2 = mbedtls_x509_time_is_past(&child->valid_to);
  if (iVar2 != 0) {
    *(byte *)flags = (byte)*flags | 1;
  }
  iVar2 = mbedtls_x509_time_is_future(&child->valid_from);
  if (iVar2 != 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 2;
  }
  if ((local_98->allowed_mds >> ((byte)((char)child->sig_md - MBEDTLS_MD_MD2) & 0x1f) & 1) == 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x40;
  }
  if ((local_98->allowed_pks >> ((byte)((char)child->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1) == 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x80;
  }
  *(byte *)flags = (byte)*flags | 8;
  local_80 = mbedtls_md_info_from_type(child->sig_md);
  if (local_80 == (mbedtls_md_info_t *)0x0) {
    trust_ca = (mbedtls_x509_crt *)0x0;
  }
  else {
    mbedtls_md(local_80,(child->tbs).p,(child->tbs).len,hash);
  }
  if (trust_ca == (mbedtls_x509_crt *)0x0) {
    local_a8 = (mbedtls_x509_crt *)0x0;
  }
  else {
    iVar3 = (int)local_a0;
    uVar5 = (uint)(iVar3 == 0);
    iVar2 = iVar3 + 1;
    local_a8 = (mbedtls_x509_crt *)0x0;
    local_ac = (uint)(iVar3 == 0);
    local_b0 = iVar2;
    do {
      iVar3 = x509_crt_check_parent(child,trust_ca,1,uVar5);
      if (iVar3 == 0) {
        iVar3 = iVar2;
        if ((child->subject_raw).len == (trust_ca->subject_raw).len) {
          iVar4 = bcmp((child->subject_raw).p,(trust_ca->subject_raw).p,(child->issuer_raw).len);
          iVar3 = (int)local_a0;
          if (iVar4 != 0) {
            iVar3 = iVar2;
          }
        }
        if ((trust_ca->max_pathlen < 1) || (iVar3 - local_8c <= trust_ca->max_pathlen)) {
          md_alg = child->sig_md;
          type = child->sig_pk;
          options = child->sig_opts;
          bVar1 = mbedtls_md_get_size(local_80);
          iVar3 = mbedtls_pk_verify_ext
                            (type,options,&trust_ca->pk,md_alg,hash,(ulong)bVar1,(child->sig).p,
                             (child->sig).len);
          iVar2 = local_b0;
          uVar5 = local_ac;
          if (iVar3 == 0) {
            iVar2 = mbedtls_x509_time_is_past(&trust_ca->valid_to);
            uVar5 = local_ac;
            if ((iVar2 == 0) &&
               (iVar2 = mbedtls_x509_time_is_future(&trust_ca->valid_from), iVar2 == 0))
            goto LAB_00124aed;
            iVar2 = local_b0;
            if (local_a8 == (mbedtls_x509_crt *)0x0) {
              local_a8 = trust_ca;
            }
          }
        }
      }
      trust_ca = trust_ca->next;
    } while (trust_ca != (mbedtls_x509_crt *)0x0);
  }
  trust_ca = local_a8;
  if (local_a8 == (mbedtls_x509_crt *)0x0) {
    trust_ca = (mbedtls_x509_crt *)0x0;
  }
  else {
LAB_00124aed:
    *(byte *)flags = (byte)*flags & 0xf7;
    iVar2 = x509_profile_check_key(local_98,child->sig_pk,&trust_ca->pk);
    if (iVar2 != 0) {
      *(byte *)((long)flags + 2) = *(byte *)((long)flags + 2) | 1;
    }
  }
  if ((trust_ca != (mbedtls_x509_crt *)0x0) &&
     (((child->subject_raw).len != (trust_ca->subject_raw).len ||
      (iVar2 = bcmp((child->subject_raw).p,(trust_ca->subject_raw).p,(child->issuer_raw).len),
      iVar2 != 0)))) {
    uVar5 = x509_crt_verifycrl(child,trust_ca,local_88,local_98);
    *flags = *flags | uVar5;
    iVar2 = mbedtls_x509_time_is_past(&trust_ca->valid_to);
    if (iVar2 != 0) {
      ca_flags = ca_flags | 1;
    }
    iVar2 = mbedtls_x509_time_is_future(&trust_ca->valid_from);
    if (iVar2 != 0) {
      ca_flags = ca_flags | 0x200;
    }
    if (f_vrfy == (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0)
    goto LAB_00124bdd;
    iVar2 = (*f_vrfy)(p_vrfy,trust_ca,(int)local_a0 + 1,&ca_flags);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  if ((f_vrfy != (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) &&
     (iVar2 = (*f_vrfy)(p_vrfy,child,(int)local_a0,flags), iVar2 != 0)) {
    return iVar2;
  }
LAB_00124bdd:
  *flags = *flags | ca_flags;
  return 0;
}

Assistant:

static int x509_crt_verify_top(
                mbedtls_x509_crt *child, mbedtls_x509_crt *trust_ca,
                mbedtls_x509_crl *ca_crl,
                const mbedtls_x509_crt_profile *profile,
                int path_cnt, int self_cnt, uint32_t *flags,
                int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                void *p_vrfy )
{
    int ret;
    uint32_t ca_flags = 0;
    int check_path_cnt;
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];
    const mbedtls_md_info_t *md_info;
    mbedtls_x509_crt *future_past_ca = NULL;

    if( mbedtls_x509_time_is_past( &child->valid_to ) )
        *flags |= MBEDTLS_X509_BADCERT_EXPIRED;

    if( mbedtls_x509_time_is_future( &child->valid_from ) )
        *flags |= MBEDTLS_X509_BADCERT_FUTURE;

    if( x509_profile_check_md_alg( profile, child->sig_md ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_MD;

    if( x509_profile_check_pk_alg( profile, child->sig_pk ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    /*
     * Child is the top of the chain. Check against the trust_ca list.
     */
    *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;

    md_info = mbedtls_md_info_from_type( child->sig_md );
    if( md_info == NULL )
    {
        /*
         * Cannot check 'unknown', no need to try any CA
         */
        trust_ca = NULL;
    }
    else
        mbedtls_md( md_info, child->tbs.p, child->tbs.len, hash );

    for( /* trust_ca */ ; trust_ca != NULL; trust_ca = trust_ca->next )
    {
        if( x509_crt_check_parent( child, trust_ca, 1, path_cnt == 0 ) != 0 )
            continue;

        check_path_cnt = path_cnt + 1;

        /*
         * Reduce check_path_cnt to check against if top of the chain is
         * the same as the trusted CA
         */
        if( child->subject_raw.len == trust_ca->subject_raw.len &&
            memcmp( child->subject_raw.p, trust_ca->subject_raw.p,
                            child->issuer_raw.len ) == 0 )
        {
            check_path_cnt--;
        }

        /* Self signed certificates do not count towards the limit */
        if( trust_ca->max_pathlen > 0 &&
            trust_ca->max_pathlen < check_path_cnt - self_cnt )
        {
            continue;
        }

        if( mbedtls_pk_verify_ext( child->sig_pk, child->sig_opts, &trust_ca->pk,
                           child->sig_md, hash, mbedtls_md_get_size( md_info ),
                           child->sig.p, child->sig.len ) != 0 )
        {
            continue;
        }

        if( mbedtls_x509_time_is_past( &trust_ca->valid_to ) ||
            mbedtls_x509_time_is_future( &trust_ca->valid_from ) )
        {
            if ( future_past_ca == NULL )
                future_past_ca = trust_ca;

            continue;
        }

        break;
    }

    if( trust_ca != NULL || ( trust_ca = future_past_ca ) != NULL )
    {
        /*
         * Top of chain is signed by a trusted CA
         */
        *flags &= ~MBEDTLS_X509_BADCERT_NOT_TRUSTED;

        if( x509_profile_check_key( profile, child->sig_pk, &trust_ca->pk ) != 0 )
            *flags |= MBEDTLS_X509_BADCERT_BAD_KEY;
    }

    /*
     * If top of chain is not the same as the trusted CA send a verify request
     * to the callback for any issues with validity and CRL presence for the
     * trusted CA certificate.
     */
    if( trust_ca != NULL &&
        ( child->subject_raw.len != trust_ca->subject_raw.len ||
          memcmp( child->subject_raw.p, trust_ca->subject_raw.p,
                            child->issuer_raw.len ) != 0 ) )
    {
#if defined(MBEDTLS_X509_CRL_PARSE_C)
        /* Check trusted CA's CRL for the chain's top crt */
        *flags |= x509_crt_verifycrl( child, trust_ca, ca_crl, profile );
#else
        ((void) ca_crl);
#endif

        if( mbedtls_x509_time_is_past( &trust_ca->valid_to ) )
            ca_flags |= MBEDTLS_X509_BADCERT_EXPIRED;

        if( mbedtls_x509_time_is_future( &trust_ca->valid_from ) )
            ca_flags |= MBEDTLS_X509_BADCERT_FUTURE;

        if( NULL != f_vrfy )
        {
            if( ( ret = f_vrfy( p_vrfy, trust_ca, path_cnt + 1,
                                &ca_flags ) ) != 0 )
            {
                return( ret );
            }
        }
    }

    /* Call callback on top cert */
    if( NULL != f_vrfy )
    {
        if( ( ret = f_vrfy( p_vrfy, child, path_cnt, flags ) ) != 0 )
            return( ret );
    }

    *flags |= ca_flags;

    return( 0 );
}